

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

void __thiscall slang::SVInt::shrinkToFit(SVInt *this)

{
  bitwidth_t bVar1;
  SVInt local_20;
  
  bVar1 = getMinRepresentedBits(this);
  if (bVar1 + (bVar1 == 0) != (this->super_SVIntStorage).bitWidth) {
    resize(&local_20,(bitwidth_t)this);
    operator=(this,&local_20);
    ~SVInt(&local_20);
  }
  return;
}

Assistant:

void SVInt::shrinkToFit() {
    bitwidth_t minBits = getMinRepresentedBits();
    if (minBits == 0)
        minBits = 1;

    if (minBits != bitWidth)
        *this = resize(minBits);
}